

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

float ImGui::TableGetHeaderRowHeight(void)

{
  float fVar1;
  ImGuiTable *table;
  ImGuiContext *pIVar2;
  char *text;
  long lVar3;
  int column_n;
  ulong uVar4;
  uint uVar5;
  ImVec2 IVar6;
  float fVar7;
  
  pIVar2 = GImGui;
  table = GImGui->CurrentTable;
  fVar7 = GImGui->FontSize;
  lVar3 = 0;
  for (uVar4 = 0; (long)uVar4 < (long)table->ColumnsCount; uVar4 = uVar4 + 1) {
    if (((table->EnabledMaskByIndex[uVar4 >> 5 & 0x7ffffff] >> ((uint)uVar4 & 0x1f) & 1) != 0) &&
       ((*(byte *)((long)&((table->Columns).Data)->Flags + lVar3 + 1) & 0x10) == 0)) {
      text = TableGetColumnName(table,(uint)uVar4);
      IVar6 = CalcTextSize(text,(char *)0x0,false,-1.0);
      uVar5 = -(uint)(IVar6.y <= fVar7);
      fVar7 = (float)(uVar5 & (uint)fVar7 | ~uVar5 & (uint)IVar6.y);
    }
    lVar3 = lVar3 + 0x70;
  }
  fVar1 = (pIVar2->Style).CellPadding.y;
  return fVar1 + fVar1 + fVar7;
}

Assistant:

float ImGui::TableGetHeaderRowHeight()
{
    // Caring for a minor edge case:
    // Calculate row height, for the unlikely case that some labels may be taller than others.
    // If we didn't do that, uneven header height would highlight but smaller one before the tallest wouldn't catch input for all height.
    // In your custom header row you may omit this all together and just call TableNextRow() without a height...
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    float row_height = g.FontSize;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (IM_BITARRAY_TESTBIT(table->EnabledMaskByIndex, column_n))
            if ((table->Columns[column_n].Flags & ImGuiTableColumnFlags_NoHeaderLabel) == 0)
                row_height = ImMax(row_height, CalcTextSize(TableGetColumnName(table, column_n)).y);
    return row_height + g.Style.CellPadding.y * 2.0f;
}